

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixNormalsStep.cpp
# Opt level: O3

bool __thiscall
Assimp::FixInfacingNormalsProcess::ProcessMesh
          (FixInfacingNormalsProcess *this,aiMesh *pcMesh,uint index)

{
  undefined8 uVar1;
  undefined8 uVar2;
  aiVector3D *paVar3;
  uint *puVar4;
  bool bVar5;
  Logger *this_00;
  ulong uVar6;
  aiFace *paVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar27;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar28;
  float fVar29;
  long *local_1e8;
  long local_1d8 [2];
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a0 [376];
  undefined1 auVar24 [16];
  
  if (pcMesh == (aiMesh *)0x0) {
    __assert_fail("nullptr != pcMesh",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/PostProcessing/FixNormalsStep.cpp"
                  ,0x69,
                  "bool Assimp::FixInfacingNormalsProcess::ProcessMesh(aiMesh *, unsigned int)");
  }
  paVar3 = pcMesh->mNormals;
  if (pcMesh->mNumVertices != 0 && paVar3 != (aiVector3D *)0x0) {
    lVar9 = 0;
    fVar20 = 1e+10;
    auVar17 = _DAT_0067a780;
    auVar19 = _DAT_0067a780;
    auVar22 = _DAT_0067a770;
    auVar26 = _DAT_0067a770;
    fVar23 = -1e+10;
    fVar27 = -1e+10;
    fVar14 = 1e+10;
    do {
      fVar15 = *(float *)((long)&pcMesh->mVertices->z + lVar9);
      fVar13 = fVar15;
      if (fVar20 <= fVar15) {
        fVar13 = fVar20;
      }
      fVar28 = fVar15;
      if (fVar15 <= fVar23) {
        fVar28 = fVar23;
      }
      auVar25._0_4_ = fVar15 + *(float *)((long)&paVar3->z + lVar9);
      uVar1 = *(undefined8 *)((long)&pcMesh->mVertices->x + lVar9);
      uVar2 = *(undefined8 *)((long)&paVar3->x + lVar9);
      fVar20 = (float)uVar1;
      fStack_1c4 = (float)((ulong)uVar1 >> 0x20);
      auVar21._0_8_ = CONCAT44((float)((ulong)uVar2 >> 0x20) + fStack_1c4,(float)uVar2 + fVar20);
      auVar21._8_8_ = 0;
      auVar25._4_8_ = 0;
      auVar25._12_4_ = fStack_1c4;
      auVar24._8_8_ = auVar25._8_8_;
      auVar24._0_8_ = CONCAT44(fVar20,auVar25._0_4_);
      fVar15 = fStack_1c4;
      if (fVar14 <= fStack_1c4) {
        fVar15 = fVar14;
      }
      fVar29 = fStack_1c4;
      if (fStack_1c4 <= fVar27) {
        fVar29 = fVar27;
      }
      auVar18._8_8_ = 0;
      auVar18._0_8_ = auVar21._0_8_;
      auVar19 = minps(auVar18,auVar19);
      auVar22 = maxps(auVar21,auVar22);
      auVar16._8_4_ = 0;
      auVar16._0_8_ = auVar24._0_8_;
      auVar16._12_4_ = fStack_1c4;
      auVar17 = minps(auVar16,auVar17);
      auVar26 = maxps(auVar24,auVar26);
      lVar9 = lVar9 + 0xc;
      fVar20 = fVar13;
      fVar23 = fVar28;
      fVar27 = fVar29;
      fVar14 = fVar15;
    } while ((ulong)pcMesh->mNumVertices * 0xc != lVar9);
    fVar20 = auVar22._0_4_ - auVar19._0_4_;
    local_1b8 = auVar22._4_4_ - auVar19._4_4_;
    fVar23 = auVar26._0_4_ - auVar17._0_4_;
    fVar27 = auVar26._4_4_ - auVar17._4_4_;
    if (fVar27 <= 0.0 != 0.0 < fVar20) {
      fVar29 = fVar29 - fVar15;
      if (0.0 < local_1b8 == fVar29 <= 0.0) {
        return false;
      }
      fVar28 = fVar28 - fVar13;
      if (fVar28 <= 0.0 == 0.0 < fVar23) {
        return false;
      }
      local_1c8 = fVar29 * fVar28;
      fStack_1c0 = fStack_1c4;
      fStack_1bc = fStack_1c4;
      fStack_1b4 = local_1b8;
      fStack_1b0 = local_1b8;
      fStack_1ac = local_1b8;
      if (local_1c8 < 0.0) {
        fVar14 = sqrtf(local_1c8);
      }
      else {
        fVar14 = SQRT(local_1c8);
      }
      if (fVar14 * 0.05 <= fVar27) {
        fVar14 = fVar27 * fVar28;
        if (fVar14 < 0.0) {
          fVar14 = sqrtf(fVar14);
        }
        else {
          fVar14 = SQRT(fVar14);
        }
        if (fVar14 * 0.05 <= fVar29) {
          fVar29 = fVar27 * fVar29;
          if (fVar29 < 0.0) {
            fVar29 = sqrtf(fVar29);
          }
          else {
            fVar29 = SQRT(fVar29);
          }
          if ((fVar29 * 0.05 <= fVar28) &&
             (ABS(fVar23 * local_1b8 * fVar20) < ABS(fVar27 * local_1c8))) {
            bVar5 = DefaultLogger::isNullLogger();
            if (!bVar5) {
              this_00 = DefaultLogger::get();
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              basic_formatter<char[6]>
                        ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a0,(char (*) [6])0x6a01e3);
              std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a0,": Normals are facing inwards (or the mesh is planar)"
                         ,0x34);
              std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
              std::__cxx11::stringbuf::str();
              Logger::info(this_00,(char *)local_1e8);
              if (local_1e8 != local_1d8) {
                operator_delete(local_1e8,local_1d8[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
              std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
            }
            if (pcMesh->mNumVertices != 0) {
              lVar9 = 8;
              uVar6 = 0;
              do {
                paVar3 = pcMesh->mNormals;
                *(ulong *)((long)paVar3 + lVar9 + -8) =
                     *(ulong *)((long)paVar3 + lVar9 + -8) ^ 0x8000000080000000;
                *(uint *)((long)&paVar3->x + lVar9) =
                     *(uint *)((long)&paVar3->x + lVar9) ^ 0x80000000;
                uVar6 = uVar6 + 1;
                lVar9 = lVar9 + 0xc;
              } while (uVar6 < pcMesh->mNumVertices);
            }
            uVar10 = pcMesh->mNumFaces;
            if (uVar10 == 0) {
              return true;
            }
            uVar6 = 0;
            do {
              uVar8 = pcMesh->mFaces[uVar6].mNumIndices;
              if (1 < uVar8) {
                paVar7 = pcMesh->mFaces + uVar6;
                iVar11 = -1;
                uVar12 = 0;
                do {
                  puVar4 = paVar7->mIndices;
                  uVar10 = puVar4[uVar12];
                  puVar4[uVar12] = puVar4[uVar8 + iVar11];
                  puVar4[uVar8 + iVar11] = uVar10;
                  uVar12 = uVar12 + 1;
                  uVar8 = paVar7->mNumIndices;
                  iVar11 = iVar11 + -1;
                } while (uVar12 < uVar8 >> 1);
                uVar10 = pcMesh->mNumFaces;
              }
              uVar6 = uVar6 + 1;
            } while (uVar6 < uVar10);
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool FixInfacingNormalsProcess::ProcessMesh( aiMesh* pcMesh, unsigned int index)
{
    ai_assert(nullptr != pcMesh);

    // Nothing to do if there are no model normals
    if (!pcMesh->HasNormals()) {
        return false;
    }

    // Compute the bounding box of both the model vertices + normals and
    // the unmodified model vertices. Then check whether the first BB
    // is smaller than the second. In this case we can assume that the
    // normals need to be flipped, although there are a few special cases ..
    // convex, concave, planar models ...

    aiVector3D vMin0 (1e10f,1e10f,1e10f);
    aiVector3D vMin1 (1e10f,1e10f,1e10f);
    aiVector3D vMax0 (-1e10f,-1e10f,-1e10f);
    aiVector3D vMax1 (-1e10f,-1e10f,-1e10f);

    for (unsigned int i = 0; i < pcMesh->mNumVertices;++i)
    {
        vMin1.x = std::min(vMin1.x,pcMesh->mVertices[i].x);
        vMin1.y = std::min(vMin1.y,pcMesh->mVertices[i].y);
        vMin1.z = std::min(vMin1.z,pcMesh->mVertices[i].z);

        vMax1.x = std::max(vMax1.x,pcMesh->mVertices[i].x);
        vMax1.y = std::max(vMax1.y,pcMesh->mVertices[i].y);
        vMax1.z = std::max(vMax1.z,pcMesh->mVertices[i].z);

        const aiVector3D vWithNormal = pcMesh->mVertices[i] + pcMesh->mNormals[i];

        vMin0.x = std::min(vMin0.x,vWithNormal.x);
        vMin0.y = std::min(vMin0.y,vWithNormal.y);
        vMin0.z = std::min(vMin0.z,vWithNormal.z);

        vMax0.x = std::max(vMax0.x,vWithNormal.x);
        vMax0.y = std::max(vMax0.y,vWithNormal.y);
        vMax0.z = std::max(vMax0.z,vWithNormal.z);
    }

    const float fDelta0_x = (vMax0.x - vMin0.x);
    const float fDelta0_y = (vMax0.y - vMin0.y);
    const float fDelta0_z = (vMax0.z - vMin0.z);

    const float fDelta1_x = (vMax1.x - vMin1.x);
    const float fDelta1_y = (vMax1.y - vMin1.y);
    const float fDelta1_z = (vMax1.z - vMin1.z);

    // Check whether the boxes are overlapping
    if ((fDelta0_x > 0.0f) != (fDelta1_x > 0.0f))return false;
    if ((fDelta0_y > 0.0f) != (fDelta1_y > 0.0f))return false;
    if ((fDelta0_z > 0.0f) != (fDelta1_z > 0.0f))return false;

    // Check whether this is a planar surface
    const float fDelta1_yz = fDelta1_y * fDelta1_z;

    if (fDelta1_x < 0.05f * std::sqrt( fDelta1_yz ))return false;
    if (fDelta1_y < 0.05f * std::sqrt( fDelta1_z * fDelta1_x ))return false;
    if (fDelta1_z < 0.05f * std::sqrt( fDelta1_y * fDelta1_x ))return false;

    // now compare the volumes of the bounding boxes
    if (std::fabs(fDelta0_x * fDelta0_y * fDelta0_z) < std::fabs(fDelta1_x * fDelta1_yz)) {
        if (!DefaultLogger::isNullLogger()) {
            ASSIMP_LOG_INFO_F("Mesh ", index, ": Normals are facing inwards (or the mesh is planar)", index);
        }

        // Invert normals
        for (unsigned int i = 0; i < pcMesh->mNumVertices;++i)
            pcMesh->mNormals[i] *= -1.0f;

        // ... and flip faces
        for (unsigned int i = 0; i < pcMesh->mNumFaces;++i)
        {
            aiFace& face = pcMesh->mFaces[i];
            for( unsigned int b = 0; b < face.mNumIndices / 2; b++)
                std::swap( face.mIndices[b], face.mIndices[ face.mNumIndices - 1 - b]);
        }
        return true;
    }
    return false;
}